

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall
QRomanCalendar::standaloneMonthName
          (QRomanCalendar *this,QLocale *locale,int month,int year,FormatType format)

{
  bool bVar1;
  QLocalePrivate *pQVar2;
  QSystemLocale *this_00;
  QCalendarBackend *in_RSI;
  QString *in_RDI;
  FormatType in_R9D;
  long in_FS_OFFSET;
  QueryType queryType;
  QVariant res;
  QVariant *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 uVar3;
  FormatType in_stack_ffffffffffffff64;
  QString *locale_00;
  uint local_70;
  undefined1 local_48 [32];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  locale_00 = in_RDI;
  pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4d26ba);
  if (pQVar2->m_data == &systemLocaleData) {
    local_70 = 0x2a;
    if (in_R9D == LongFormat) {
      local_70 = 0x2a;
    }
    else if (in_R9D == ShortFormat) {
      local_70 = 0x2b;
    }
    else if (in_R9D == NarrowFormat) {
      local_70 = 0x2c;
    }
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = systemLocale();
    ::QVariant::QVariant
              ((QVariant *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               (int)((ulong)this_00 >> 0x20));
    (*this_00->_vptr_QSystemLocale[2])(&local_28,this_00,(ulong)local_70,local_48);
    ::QVariant::~QVariant((QVariant *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40))
    ;
    bVar1 = ::QVariant::isNull((QVariant *)this_00);
    uVar3 = bVar1;
    in_stack_ffffffffffffff64 = in_R9D;
    if (!bVar1) {
      ::QVariant::toString(in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff64 = in_R9D;
    }
    ::QVariant::~QVariant((QVariant *)CONCAT17(uVar3,in_stack_ffffffffffffff40));
    if (!bVar1) goto LAB_004d284b;
  }
  QCalendarBackend::standaloneMonthName
            (in_RSI,(QLocale *)locale_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             in_stack_ffffffffffffff64);
LAB_004d284b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return locale_00;
}

Assistant:

QString QRomanCalendar::standaloneMonthName(const QLocale &locale, int month, int year,
                                            QLocale::FormatType format) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (locale.d->m_data == &systemLocaleData) {
        Q_ASSERT(month >= 1 && month <= 12);
        QSystemLocale::QueryType queryType = QSystemLocale::StandaloneMonthNameLong;
        switch (format) {
        case QLocale::LongFormat:
            queryType = QSystemLocale::StandaloneMonthNameLong;
            break;
        case QLocale::ShortFormat:
            queryType = QSystemLocale::StandaloneMonthNameShort;
            break;
        case QLocale::NarrowFormat:
            queryType = QSystemLocale::StandaloneMonthNameNarrow;
            break;
        }
        QVariant res = systemLocale()->query(queryType, month);
        if (!res.isNull())
            return res.toString();
    }
#endif

    return QCalendarBackend::standaloneMonthName(locale, month, year, format);
}